

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  void *pvVar8;
  int y;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  int *xofs;
  void *pvVar12;
  void *pvVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint _c;
  uint uVar19;
  int iVar20;
  long lVar21;
  void *pvVar22;
  uint uVar23;
  int iVar24;
  void *pvVar25;
  int iVar26;
  long lVar27;
  float *pfVar28;
  void *pvVar29;
  float *rows1_old;
  void *pvVar30;
  uint uVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  void *local_220;
  float *local_218;
  ulong local_208;
  Mat rowsbuf0;
  Mat dst_1;
  Mat rowsbuf2;
  Mat dst;
  Mat rowsbuf1;
  Mat src;
  
  _c = bottom_blob->w;
  uVar31 = this->output_width;
  uVar15 = this->output_height;
  if (bottom_blob->dims == 1) {
    uVar23 = 1;
    uVar19 = 1;
  }
  else {
    uVar19 = bottom_blob->h;
    uVar23 = _c;
    _c = bottom_blob->c;
  }
  local_208 = (ulong)_c;
  if (uVar31 == 0 || uVar15 == 0) {
    uVar15 = (uint)((float)(int)uVar19 * this->height_scale);
    uVar31 = (uint)((float)(int)uVar23 * this->width_scale);
  }
  uVar18 = (ulong)uVar31;
  uVar32 = (ulong)uVar15;
  if ((uVar15 == uVar19) && (uVar31 == uVar23)) {
    Mat::operator=(top_blob,bottom_blob);
  }
  else {
    Mat::create(top_blob,uVar31,uVar15,_c,bottom_blob->elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (bottom_blob->dims == 1) {
      if ((int)_c < 1) {
        local_208 = 0;
      }
      for (uVar32 = 0; local_208 != uVar32; uVar32 = uVar32 + 1) {
        Mat::channel(&rowsbuf0,top_blob,(int)uVar32);
        Mat::fill(&rowsbuf0,*(float *)((long)bottom_blob->data + uVar32 * 4));
        Mat::~Mat(&rowsbuf0);
      }
    }
    else {
      uVar5 = this->resize_type;
      lVar27 = (long)(int)uVar31;
      lVar21 = (long)(int)uVar15;
      if (uVar5 == 3) {
        iVar26 = uVar15 * 5 + uVar31 * 5;
        uVar32 = (long)iVar26 * 4;
        if (iVar26 < 0) {
          uVar32 = 0xffffffffffffffff;
        }
        xofs = (int *)operator_new__(uVar32);
        piVar1 = xofs + lVar27;
        pfVar2 = (float *)(piVar1 + lVar21);
        cubic_coeffs(uVar23,uVar31,xofs,pfVar2);
        cubic_coeffs(uVar19,uVar15,piVar1,pfVar2 + (int)(uVar31 * 4));
        if ((int)_c < 1) {
          _c = 0;
        }
        for (uVar15 = 0; uVar15 != _c; uVar15 = uVar15 + 1) {
          Mat::channel(&src,bottom_blob,uVar15);
          Mat::channel(&dst,top_blob,uVar15);
          uVar23 = dst.h;
          uVar19 = dst.w;
          Mat::Mat(&rowsbuf0,dst.w,4,(Allocator *)0x0);
          Mat::Mat(&rowsbuf1,uVar19,4,(Allocator *)0x0);
          Mat::Mat(&rowsbuf2,uVar19,4,(Allocator *)0x0);
          Mat::Mat(&dst_1,uVar19,4,(Allocator *)0x0);
          local_220 = dst_1.data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          lVar14 = (ulong)uVar19 * 4;
          pvVar10 = rowsbuf2.data;
          pvVar30 = rowsbuf0.data;
          pvVar25 = dst.data;
          pvVar12 = rowsbuf1.data;
          local_218 = pfVar2 + (int)(uVar31 * 4);
          iVar26 = -3;
          for (uVar32 = 0; uVar32 != uVar23; uVar32 = uVar32 + 1) {
            iVar20 = piVar1[uVar32];
            pvVar13 = local_220;
            pvVar22 = pvVar30;
            pvVar8 = pvVar10;
            pvVar29 = pvVar12;
            if (iVar20 != iVar26) {
              if (iVar20 == iVar26 + 1) {
                for (lVar11 = 0; pvVar13 = pvVar30, pvVar22 = pvVar12, pvVar8 = local_220,
                    pvVar29 = pvVar10, lVar14 - lVar11 != 0; lVar11 = lVar11 + 4) {
                  pfVar28 = (float *)(xofs + lVar27 + lVar21 + lVar11);
                  pfVar3 = (float *)((long)src.data +
                                    (long)*(int *)((long)xofs + lVar11) * 4 +
                                    (long)((iVar20 + 2) * src.w) * src.elemsize + -4);
                  *(float *)((long)pvVar30 + lVar11) =
                       pfVar3[3] * pfVar28[3] + pfVar3[1] * pfVar28[1] +
                       pfVar3[2] * pfVar28[2] + *pfVar3 * *pfVar28;
                }
              }
              else if (iVar20 == iVar26 + 2) {
                for (lVar11 = 0; pvVar13 = pvVar12, pvVar22 = pvVar10, pvVar8 = pvVar30,
                    pvVar29 = local_220, lVar14 - lVar11 != 0; lVar11 = lVar11 + 4) {
                  iVar26 = *(int *)((long)xofs + lVar11);
                  pfVar28 = (float *)(xofs + lVar27 + lVar21 + lVar11);
                  fVar33 = *pfVar28;
                  fVar34 = pfVar28[1];
                  fVar6 = pfVar28[2];
                  fVar7 = pfVar28[3];
                  pfVar28 = (float *)((long)src.data +
                                     (long)iVar26 * 4 +
                                     (long)((iVar20 + 1) * src.w) * src.elemsize + -4);
                  *(float *)((long)pvVar30 + lVar11) =
                       pfVar28[3] * fVar7 + pfVar28[1] * fVar34 +
                       pfVar28[2] * fVar6 + *pfVar28 * fVar33;
                  pfVar28 = (float *)((long)src.data +
                                     (long)iVar26 * 4 +
                                     (long)((iVar20 + 2) * src.w) * src.elemsize + -4);
                  *(float *)((long)pvVar12 + lVar11) =
                       pfVar28[3] * fVar7 + pfVar28[1] * fVar34 +
                       pfVar28[2] * fVar6 + *pfVar28 * fVar33;
                }
              }
              else if (iVar20 == iVar26 + 3) {
                for (lVar11 = 0; pvVar13 = pvVar10, pvVar22 = local_220, pvVar8 = pvVar12,
                    pvVar29 = pvVar30, lVar14 - lVar11 != 0; lVar11 = lVar11 + 4) {
                  lVar17 = (long)*(int *)((long)xofs + lVar11);
                  pfVar28 = (float *)(xofs + lVar27 + lVar21 + lVar11);
                  fVar33 = *pfVar28;
                  fVar34 = pfVar28[1];
                  fVar6 = pfVar28[2];
                  fVar7 = pfVar28[3];
                  pfVar28 = (float *)((long)src.data +
                                     lVar17 * 4 + (long)(iVar20 * src.w) * src.elemsize + -4);
                  *(float *)((long)pvVar30 + lVar11) =
                       pfVar28[3] * fVar7 + pfVar28[1] * fVar34 +
                       pfVar28[2] * fVar6 + *pfVar28 * fVar33;
                  pfVar28 = (float *)((long)src.data +
                                     lVar17 * 4 + (long)((iVar20 + 1) * src.w) * src.elemsize + -4);
                  *(float *)((long)pvVar12 + lVar11) =
                       pfVar28[3] * fVar7 + pfVar28[1] * fVar34 +
                       pfVar28[2] * fVar6 + *pfVar28 * fVar33;
                  pfVar28 = (float *)((long)src.data +
                                     lVar17 * 4 + (long)((iVar20 + 2) * src.w) * src.elemsize + -4);
                  *(float *)((long)pvVar10 + lVar11) =
                       pfVar28[3] * fVar7 + pfVar28[1] * fVar34 +
                       pfVar28[2] * fVar6 + *pfVar28 * fVar33;
                }
              }
              else {
                for (lVar11 = 0; lVar14 - lVar11 != 0; lVar11 = lVar11 + 4) {
                  lVar17 = (long)*(int *)((long)xofs + lVar11);
                  pfVar28 = (float *)(xofs + lVar27 + lVar21 + lVar11);
                  fVar33 = *pfVar28;
                  fVar34 = pfVar28[1];
                  fVar6 = pfVar28[2];
                  fVar7 = pfVar28[3];
                  pfVar28 = (float *)((long)src.data +
                                     lVar17 * 4 + (long)((iVar20 + -1) * src.w) * src.elemsize + -4)
                  ;
                  *(float *)((long)pvVar30 + lVar11) =
                       pfVar28[3] * fVar7 + pfVar28[1] * fVar34 +
                       pfVar28[2] * fVar6 + *pfVar28 * fVar33;
                  pfVar28 = (float *)((long)src.data +
                                     lVar17 * 4 + (long)(iVar20 * src.w) * src.elemsize + -4);
                  *(float *)((long)pvVar12 + lVar11) =
                       pfVar28[3] * fVar7 + pfVar28[1] * fVar34 +
                       pfVar28[2] * fVar6 + *pfVar28 * fVar33;
                  pfVar28 = (float *)((long)src.data +
                                     lVar17 * 4 + (long)((iVar20 + 1) * src.w) * src.elemsize + -4);
                  *(float *)((long)pvVar10 + lVar11) =
                       pfVar28[3] * fVar7 + pfVar28[1] * fVar34 +
                       pfVar28[2] * fVar6 + *pfVar28 * fVar33;
                  pfVar28 = (float *)((long)src.data +
                                     lVar17 * 4 + (long)((iVar20 + 2) * src.w) * src.elemsize + -4);
                  *(float *)((long)local_220 + lVar11) =
                       pfVar28[3] * fVar7 + pfVar28[1] * fVar34 +
                       pfVar28[2] * fVar6 + *pfVar28 * fVar33;
                }
              }
            }
            pvVar10 = pvVar8;
            fVar33 = *local_218;
            fVar34 = local_218[1];
            fVar6 = local_218[2];
            fVar7 = local_218[3];
            for (lVar11 = 0; uVar19 != (uint)lVar11; lVar11 = lVar11 + 1) {
              *(float *)((long)pvVar25 + lVar11 * 4) =
                   *(float *)((long)pvVar13 + lVar11 * 4) * fVar7 +
                   *(float *)((long)pvVar29 + lVar11 * 4) * fVar34 +
                   *(float *)((long)pvVar10 + lVar11 * 4) * fVar6 +
                   *(float *)((long)pvVar22 + lVar11 * 4) * fVar33;
            }
            local_218 = local_218 + 4;
            pvVar25 = (void *)((long)pvVar25 + (long)dst.w * dst.elemsize);
            pvVar30 = pvVar22;
            pvVar12 = pvVar29;
            local_220 = pvVar13;
            iVar26 = iVar20;
          }
          Mat::~Mat(&dst_1);
          Mat::~Mat(&rowsbuf2);
          Mat::~Mat(&rowsbuf1);
          Mat::~Mat(&rowsbuf0);
          Mat::~Mat(&dst);
          Mat::~Mat(&src);
        }
      }
      else {
        if (uVar5 != 2) {
          if (uVar5 == 1) {
            if ((int)uVar31 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar15 < 1) {
              uVar32 = 0;
            }
            if ((int)_c < 1) {
              _c = 0;
            }
            for (uVar31 = 0; uVar31 != _c; uVar31 = uVar31 + 1) {
              Mat::channel(&rowsbuf0,bottom_blob,uVar31);
              pvVar10 = rowsbuf0.data;
              Mat::~Mat(&rowsbuf0);
              Mat::channel(&rowsbuf0,top_blob,uVar31);
              pvVar30 = rowsbuf0.data;
              Mat::~Mat(&rowsbuf0);
              for (uVar9 = 0; uVar9 != uVar32; uVar9 = uVar9 + 1) {
                iVar26 = (int)((float)(int)uVar9 / this->height_scale);
                if ((int)(uVar19 - 1) < iVar26) {
                  iVar26 = uVar19 - 1;
                }
                for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
                  iVar24 = (int)((float)(int)uVar16 / this->width_scale);
                  iVar20 = uVar23 - 1;
                  if (iVar24 <= (int)(uVar23 - 1)) {
                    iVar20 = iVar24;
                  }
                  *(undefined4 *)((long)pvVar30 + uVar16 * 4) =
                       *(undefined4 *)((long)pvVar10 + (long)(int)(iVar20 + iVar26 * uVar23) * 4);
                }
                pvVar30 = (void *)((long)pvVar30 + lVar27 * 4);
              }
            }
            return 0;
          }
          fprintf(_stderr,"unsupported resize type %d %d %d\n",(ulong)uVar5,uVar32,uVar18);
          return -0xe9;
        }
        iVar26 = uVar15 * 3 + uVar31 * 3;
        uVar32 = (long)iVar26 * 4;
        if (iVar26 < 0) {
          uVar32 = 0xffffffffffffffff;
        }
        xofs = (int *)operator_new__(uVar32);
        piVar1 = xofs + lVar27;
        pfVar2 = (float *)(piVar1 + lVar21);
        linear_coeffs(uVar23,uVar31,xofs,pfVar2);
        linear_coeffs(uVar19,uVar15,piVar1,pfVar2 + (int)(uVar31 * 2));
        if ((int)_c < 1) {
          _c = 0;
        }
        uVar15 = 0;
        while( true ) {
          if (uVar15 == _c) break;
          Mat::channel(&rowsbuf2,bottom_blob,uVar15);
          Mat::channel(&dst_1,top_blob,uVar15);
          uVar23 = dst_1.h;
          uVar19 = dst_1.w;
          Mat::Mat(&rowsbuf0,dst_1.w,4,(Allocator *)0x0);
          Mat::Mat(&rowsbuf1,uVar19,4,(Allocator *)0x0);
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar23 < 1) {
            uVar23 = 0;
          }
          pvVar10 = rowsbuf0.data;
          pvVar30 = dst_1.data;
          pfVar28 = pfVar2 + (int)(uVar31 * 2);
          pvVar25 = rowsbuf1.data;
          iVar26 = -2;
          for (uVar32 = 0; uVar32 != uVar23; uVar32 = uVar32 + 1) {
            iVar20 = piVar1[uVar32];
            pvVar12 = pvVar10;
            pvVar13 = pvVar25;
            if (iVar20 != iVar26) {
              if (iVar20 == iVar26 + 1) {
                for (uVar18 = 0; pvVar12 = pvVar25, pvVar13 = pvVar10, uVar19 != uVar18;
                    uVar18 = uVar18 + 1) {
                  uVar4 = *(undefined8 *)
                           ((long)rowsbuf2.data +
                           (long)xofs[uVar18] * 4 +
                           (long)((iVar20 + 1) * rowsbuf2.w) * rowsbuf2.elemsize);
                  *(float *)((long)pvVar10 + uVar18 * 4) =
                       (float)((ulong)uVar4 >> 0x20) *
                       (float)((ulong)*(undefined8 *)(xofs + lVar27 + lVar21 + uVar18 * 2) >> 0x20)
                       + (float)uVar4 * (float)*(undefined8 *)(xofs + lVar27 + lVar21 + uVar18 * 2);
                }
              }
              else {
                for (uVar18 = 0; uVar19 != uVar18; uVar18 = uVar18 + 1) {
                  iVar26 = xofs[uVar18];
                  uVar4 = *(undefined8 *)
                           ((long)rowsbuf2.data +
                           (long)iVar26 * 4 + (long)(iVar20 * rowsbuf2.w) * rowsbuf2.elemsize);
                  fVar33 = (float)*(undefined8 *)(xofs + lVar27 + lVar21 + uVar18 * 2);
                  fVar34 = (float)((ulong)*(undefined8 *)(xofs + lVar27 + lVar21 + uVar18 * 2) >>
                                  0x20);
                  *(float *)((long)pvVar10 + uVar18 * 4) =
                       (float)((ulong)uVar4 >> 0x20) * fVar34 + (float)uVar4 * fVar33;
                  uVar4 = *(undefined8 *)
                           ((long)rowsbuf2.data +
                           (long)iVar26 * 4 + (long)((iVar20 + 1) * rowsbuf2.w) * rowsbuf2.elemsize)
                  ;
                  *(float *)((long)pvVar25 + uVar18 * 4) =
                       (float)((ulong)uVar4 >> 0x20) * fVar34 + (float)uVar4 * fVar33;
                }
              }
            }
            uVar4 = *(undefined8 *)pfVar28;
            for (lVar14 = 0; uVar19 != (uint)lVar14; lVar14 = lVar14 + 1) {
              *(float *)((long)pvVar30 + lVar14 * 4) =
                   *(float *)((long)pvVar13 + lVar14 * 4) * (float)((ulong)uVar4 >> 0x20) +
                   *(float *)((long)pvVar12 + lVar14 * 4) * (float)uVar4;
            }
            pfVar28 = pfVar28 + 2;
            pvVar30 = (void *)((long)pvVar30 + (long)dst_1.w * dst_1.elemsize);
            pvVar10 = pvVar12;
            pvVar25 = pvVar13;
            iVar26 = iVar20;
          }
          Mat::~Mat(&rowsbuf1);
          Mat::~Mat(&rowsbuf0);
          Mat::~Mat(&dst_1);
          Mat::~Mat(&rowsbuf2);
          uVar15 = uVar15 + 1;
        }
      }
      operator_delete__(xofs);
    }
  }
  return 0;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)// nearest
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        int* buf = new int[ow + oh + ow*2 + oh*2];

        int* xofs = buf;//new int[ow];
        int* yofs = buf + ow;//new int[oh];

        float* alpha = (float*)(buf + ow + oh);//new float[ow * 2];
        float* beta = (float*)(buf + ow + oh + ow*2);//new float[oh * 2];

        linear_coeffs(w, ow, xofs, alpha);
        linear_coeffs(h, oh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;

        return 0;
    }
    else if (resize_type == 3)// bicubic
    {
        int* buf = new int[ow + oh + ow*4 + oh*4];

        int* xofs = buf;//new int[ow];
        int* yofs = buf + ow;//new int[oh];

        float* alpha = (float*)(buf + ow + oh);//new float[ow * 4];
        float* beta = (float*)(buf + ow + oh + ow*4);//new float[oh * 4];

        cubic_coeffs(w, ow, xofs, alpha);
        cubic_coeffs(h, oh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;

        return 0;
    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}